

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O1

void __thiscall
irr::video::COpenGLDriver::getColorBuffer
          (COpenGLDriver *this,void *vertices,u32 vertexCount,E_VERTEX_TYPE vType)

{
  pointer puVar1;
  ulong uVar2;
  uchar *puVar3;
  array<unsigned_char> *this_00;
  uint uVar4;
  ulong __new_size;
  
  uVar4 = vertexCount << 2;
  __new_size = (ulong)uVar4;
  this_00 = &this->ColorBuffer;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this_00->m_data,__new_size);
  if (vType == EVT_STANDARD) {
    if (uVar4 != 0) {
      puVar3 = (uchar *)((long)vertices + 0x18);
      uVar2 = 0;
      do {
        puVar1 = (this_00->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar1[uVar2] = puVar3[2];
        puVar1[uVar2 + 1] = puVar3[1];
        puVar1[uVar2 + 2] = *puVar3;
        puVar1[uVar2 + 3] = puVar3[3];
        uVar2 = uVar2 + 4;
        puVar3 = puVar3 + 0x24;
      } while (uVar2 < __new_size);
    }
  }
  else if (vType == EVT_2TCOORDS) {
    if (uVar4 != 0) {
      puVar3 = (uchar *)((long)vertices + 0x18);
      uVar2 = 0;
      do {
        puVar1 = (this_00->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar1[uVar2] = puVar3[2];
        puVar1[uVar2 + 1] = puVar3[1];
        puVar1[uVar2 + 2] = *puVar3;
        puVar1[uVar2 + 3] = puVar3[3];
        uVar2 = uVar2 + 4;
        puVar3 = puVar3 + 0x2c;
      } while (uVar2 < __new_size);
    }
  }
  else if ((vType == EVT_TANGENTS) && (uVar4 != 0)) {
    puVar3 = (uchar *)((long)vertices + 0x18);
    uVar2 = 0;
    do {
      puVar1 = (this_00->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar1[uVar2] = puVar3[2];
      puVar1[uVar2 + 1] = puVar3[1];
      puVar1[uVar2 + 2] = *puVar3;
      puVar1[uVar2 + 3] = puVar3[3];
      uVar2 = uVar2 + 4;
      puVar3 = puVar3 + 0x3c;
    } while (uVar2 < __new_size);
  }
  return;
}

Assistant:

void COpenGLDriver::getColorBuffer(const void *vertices, u32 vertexCount, E_VERTEX_TYPE vType)
{
	// convert colors to gl color format.
	vertexCount *= 4; // reused as color component count
	ColorBuffer.set_used(vertexCount);
	u32 i;

	switch (vType) {
	case EVT_STANDARD: {
		const S3DVertex *p = static_cast<const S3DVertex *>(vertices);
		for (i = 0; i < vertexCount; i += 4) {
			p->Color.toOpenGLColor(&ColorBuffer[i]);
			++p;
		}
	} break;
	case EVT_2TCOORDS: {
		const S3DVertex2TCoords *p = static_cast<const S3DVertex2TCoords *>(vertices);
		for (i = 0; i < vertexCount; i += 4) {
			p->Color.toOpenGLColor(&ColorBuffer[i]);
			++p;
		}
	} break;
	case EVT_TANGENTS: {
		const S3DVertexTangents *p = static_cast<const S3DVertexTangents *>(vertices);
		for (i = 0; i < vertexCount; i += 4) {
			p->Color.toOpenGLColor(&ColorBuffer[i]);
			++p;
		}
	} break;
	}
}